

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  undefined4 uVar11;
  float fVar12;
  Scene *pSVar13;
  Geometry *pGVar14;
  RTCFilterFunctionN p_Var15;
  undefined8 uVar16;
  undefined8 uVar17;
  ulong uVar18;
  byte bVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  ulong uVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  ulong *puVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  bool bVar32;
  bool bVar33;
  ulong uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [64];
  undefined1 auVar71 [16];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_b90 [16];
  long local_b78;
  ulong local_b70;
  ulong local_b68;
  undefined1 local_b60 [16];
  undefined1 local_b50 [16];
  undefined1 local_b40 [16];
  undefined1 local_b30 [16];
  undefined1 local_b20 [16];
  undefined1 local_b10 [16];
  RTCFilterFunctionNArguments local_b00;
  undefined1 local_ad0 [16];
  undefined1 local_ac0 [32];
  RTCHitN local_a90 [16];
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  uint local_a20;
  uint uStack_a1c;
  uint uStack_a18;
  uint uStack_a14;
  uint uStack_a10;
  uint uStack_a0c;
  uint uStack_a08;
  uint uStack_a04;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  char local_900;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820;
  size_t local_800;
  ulong local_7f8 [249];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  puVar28 = local_7f8;
  local_800 = root.ptr;
  auVar35 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar73 = ZEXT1664(auVar35);
  auVar35 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar74 = ZEXT1664(auVar35);
  auVar35 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar75 = ZEXT1664(auVar35);
  fVar7 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar35 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar7 * 0.99999964)));
  auVar76 = ZEXT1664(auVar35);
  auVar35 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar8 * 0.99999964)));
  auVar77 = ZEXT1664(auVar35);
  auVar35 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar9 * 0.99999964)));
  auVar78 = ZEXT1664(auVar35);
  fVar7 = fVar7 * 1.0000004;
  fVar8 = fVar8 * 1.0000004;
  fVar9 = fVar9 * 1.0000004;
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_b68 = uVar29 ^ 0x10;
  iVar10 = (tray->tnear).field_0.i[k];
  auVar70 = ZEXT1664(CONCAT412(iVar10,CONCAT48(iVar10,CONCAT44(iVar10,iVar10))));
  iVar10 = (tray->tfar).field_0.i[k];
  auVar72 = ZEXT1664(CONCAT412(iVar10,CONCAT48(iVar10,CONCAT44(iVar10,iVar10))));
  local_ad0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  bVar33 = true;
  do {
    uVar30 = puVar28[-1];
    puVar28 = puVar28 + -1;
    auVar35 = auVar70._0_16_;
    auVar71 = auVar72._0_16_;
    while ((uVar30 & 8) == 0) {
      auVar36 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar30 + 0x20 + uVar29),auVar73._0_16_);
      auVar36 = vmulps_avx512vl(auVar76._0_16_,auVar36);
      auVar37 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar30 + 0x20 + uVar31),auVar74._0_16_);
      auVar37 = vmulps_avx512vl(auVar77._0_16_,auVar37);
      auVar36 = vmaxps_avx(auVar36,auVar37);
      auVar37 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar30 + 0x20 + uVar25),auVar75._0_16_);
      auVar37 = vmulps_avx512vl(auVar78._0_16_,auVar37);
      auVar37 = vmaxps_avx(auVar37,auVar35);
      auVar36 = vmaxps_avx(auVar36,auVar37);
      auVar37 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar30 + 0x20 + local_b68),auVar73._0_16_);
      auVar38._0_4_ = fVar7 * auVar37._0_4_;
      auVar38._4_4_ = fVar7 * auVar37._4_4_;
      auVar38._8_4_ = fVar7 * auVar37._8_4_;
      auVar38._12_4_ = fVar7 * auVar37._12_4_;
      auVar37 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar30 + 0x20 + (uVar31 ^ 0x10)),
                                auVar74._0_16_);
      auVar61._0_4_ = fVar8 * auVar37._0_4_;
      auVar61._4_4_ = fVar8 * auVar37._4_4_;
      auVar61._8_4_ = fVar8 * auVar37._8_4_;
      auVar61._12_4_ = fVar8 * auVar37._12_4_;
      auVar37 = vminps_avx(auVar38,auVar61);
      auVar38 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar30 + 0x20 + (uVar25 ^ 0x10)),
                                auVar75._0_16_);
      auVar62._0_4_ = fVar9 * auVar38._0_4_;
      auVar62._4_4_ = fVar9 * auVar38._4_4_;
      auVar62._8_4_ = fVar9 * auVar38._8_4_;
      auVar62._12_4_ = fVar9 * auVar38._12_4_;
      auVar38 = vminps_avx(auVar62,auVar71);
      auVar37 = vminps_avx(auVar37,auVar38);
      uVar26 = vcmpps_avx512vl(auVar36,auVar37,2);
      if ((char)uVar26 == '\0') goto LAB_006dd1a1;
      uVar22 = uVar30 & 0xfffffffffffffff0;
      lVar24 = 0;
      for (uVar30 = uVar26; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      uVar30 = *(ulong *)(uVar22 + lVar24 * 8);
      uVar27 = (uint)uVar26 - 1 & (uint)uVar26;
      uVar26 = (ulong)uVar27;
      if (uVar27 != 0) {
        *puVar28 = uVar30;
        lVar24 = 0;
        for (; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
          lVar24 = lVar24 + 1;
        }
        uVar27 = uVar27 - 1 & uVar27;
        uVar26 = (ulong)uVar27;
        bVar32 = uVar27 == 0;
        while( true ) {
          puVar28 = puVar28 + 1;
          uVar30 = *(ulong *)(uVar22 + lVar24 * 8);
          if (bVar32) break;
          *puVar28 = uVar30;
          lVar24 = 0;
          for (uVar30 = uVar26; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
            lVar24 = lVar24 + 1;
          }
          uVar26 = uVar26 - 1 & uVar26;
          bVar32 = uVar26 == 0;
        }
      }
    }
    uVar26 = (ulong)((uint)uVar30 & 0xf);
    if (uVar26 != 8) {
      uVar30 = uVar30 & 0xfffffffffffffff0;
      local_b78 = 0;
      do {
        lVar23 = local_b78 * 0xe0;
        lVar24 = uVar30 + 0xd0 + lVar23;
        local_a00 = *(undefined8 *)(lVar24 + 0x10);
        uStack_9f8 = *(undefined8 *)(lVar24 + 0x18);
        lVar24 = uVar30 + 0xc0 + lVar23;
        local_9e0 = *(undefined8 *)(lVar24 + 0x10);
        uStack_9d8 = *(undefined8 *)(lVar24 + 0x18);
        uStack_9d0 = local_9e0;
        uStack_9c8 = uStack_9d8;
        uStack_9f0 = local_a00;
        uStack_9e8 = uStack_9f8;
        auVar60._16_16_ = *(undefined1 (*) [16])(uVar30 + 0x60 + lVar23);
        auVar60._0_16_ = *(undefined1 (*) [16])(uVar30 + lVar23);
        auVar41._16_16_ = *(undefined1 (*) [16])(uVar30 + 0x70 + lVar23);
        auVar41._0_16_ = *(undefined1 (*) [16])(uVar30 + 0x10 + lVar23);
        auVar42._16_16_ = *(undefined1 (*) [16])(uVar30 + 0x80 + lVar23);
        auVar42._0_16_ = *(undefined1 (*) [16])(uVar30 + 0x20 + lVar23);
        auVar36 = *(undefined1 (*) [16])(uVar30 + 0x30 + lVar23);
        auVar46._16_16_ = auVar36;
        auVar46._0_16_ = auVar36;
        auVar36 = *(undefined1 (*) [16])(uVar30 + 0x40 + lVar23);
        auVar47._16_16_ = auVar36;
        auVar47._0_16_ = auVar36;
        auVar36 = *(undefined1 (*) [16])(uVar30 + 0x50 + lVar23);
        auVar48._16_16_ = auVar36;
        auVar48._0_16_ = auVar36;
        auVar36 = *(undefined1 (*) [16])(uVar30 + 0x90 + lVar23);
        auVar49._16_16_ = auVar36;
        auVar49._0_16_ = auVar36;
        auVar36 = *(undefined1 (*) [16])(uVar30 + 0xa0 + lVar23);
        auVar50._16_16_ = auVar36;
        auVar50._0_16_ = auVar36;
        auVar36 = *(undefined1 (*) [16])(uVar30 + 0xb0 + lVar23);
        auVar51._16_16_ = auVar36;
        auVar51._0_16_ = auVar36;
        uVar11 = *(undefined4 *)(ray + k * 4);
        auVar52._4_4_ = uVar11;
        auVar52._0_4_ = uVar11;
        auVar52._8_4_ = uVar11;
        auVar52._12_4_ = uVar11;
        auVar52._16_4_ = uVar11;
        auVar52._20_4_ = uVar11;
        auVar52._24_4_ = uVar11;
        auVar52._28_4_ = uVar11;
        auVar39 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
        auVar40 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
        uVar11 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar66._4_4_ = uVar11;
        auVar66._0_4_ = uVar11;
        auVar66._8_4_ = uVar11;
        auVar66._12_4_ = uVar11;
        auVar66._16_4_ = uVar11;
        auVar66._20_4_ = uVar11;
        auVar66._24_4_ = uVar11;
        auVar66._28_4_ = uVar11;
        uVar11 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar68._4_4_ = uVar11;
        auVar68._0_4_ = uVar11;
        auVar68._8_4_ = uVar11;
        auVar68._12_4_ = uVar11;
        auVar68._16_4_ = uVar11;
        auVar68._20_4_ = uVar11;
        auVar68._24_4_ = uVar11;
        auVar68._28_4_ = uVar11;
        fVar12 = *(float *)(ray + k * 4 + 0x60);
        auVar69._4_4_ = fVar12;
        auVar69._0_4_ = fVar12;
        auVar69._8_4_ = fVar12;
        auVar69._12_4_ = fVar12;
        auVar69._16_4_ = fVar12;
        auVar69._20_4_ = fVar12;
        auVar69._24_4_ = fVar12;
        auVar69._28_4_ = fVar12;
        auVar60 = vsubps_avx(auVar60,auVar52);
        auVar41 = vsubps_avx512vl(auVar41,auVar39);
        auVar42 = vsubps_avx512vl(auVar42,auVar40);
        auVar43 = vsubps_avx512vl(auVar46,auVar52);
        auVar44 = vsubps_avx512vl(auVar47,auVar39);
        auVar45 = vsubps_avx512vl(auVar48,auVar40);
        auVar59 = vsubps_avx(auVar49,auVar52);
        auVar46 = vsubps_avx512vl(auVar50,auVar39);
        auVar47 = vsubps_avx512vl(auVar51,auVar40);
        auVar39 = vsubps_avx(auVar59,auVar60);
        auVar48 = vsubps_avx512vl(auVar46,auVar41);
        auVar40 = vsubps_avx(auVar47,auVar42);
        auVar49 = vsubps_avx512vl(auVar60,auVar43);
        auVar50 = vsubps_avx512vl(auVar41,auVar44);
        auVar51 = vsubps_avx512vl(auVar42,auVar45);
        auVar52 = vsubps_avx512vl(auVar43,auVar59);
        auVar53 = vsubps_avx512vl(auVar44,auVar46);
        auVar54 = vsubps_avx512vl(auVar45,auVar47);
        auVar63._0_4_ = auVar59._0_4_ + auVar60._0_4_;
        auVar63._4_4_ = auVar59._4_4_ + auVar60._4_4_;
        auVar63._8_4_ = auVar59._8_4_ + auVar60._8_4_;
        auVar63._12_4_ = auVar59._12_4_ + auVar60._12_4_;
        auVar63._16_4_ = auVar59._16_4_ + auVar60._16_4_;
        auVar63._20_4_ = auVar59._20_4_ + auVar60._20_4_;
        auVar63._24_4_ = auVar59._24_4_ + auVar60._24_4_;
        auVar63._28_4_ = auVar59._28_4_ + auVar60._28_4_;
        auVar55 = vaddps_avx512vl(auVar46,auVar41);
        auVar56 = vaddps_avx512vl(auVar47,auVar42);
        auVar57 = vmulps_avx512vl(auVar55,auVar40);
        auVar57 = vfmsub231ps_avx512vl(auVar57,auVar48,auVar56);
        auVar56 = vmulps_avx512vl(auVar56,auVar39);
        auVar58 = vfmsub231ps_avx512vl(auVar56,auVar40,auVar63);
        auVar56._4_4_ = auVar48._4_4_ * auVar63._4_4_;
        auVar56._0_4_ = auVar48._0_4_ * auVar63._0_4_;
        auVar56._8_4_ = auVar48._8_4_ * auVar63._8_4_;
        auVar56._12_4_ = auVar48._12_4_ * auVar63._12_4_;
        auVar56._16_4_ = auVar48._16_4_ * auVar63._16_4_;
        auVar56._20_4_ = auVar48._20_4_ * auVar63._20_4_;
        auVar56._24_4_ = auVar48._24_4_ * auVar63._24_4_;
        auVar56._28_4_ = auVar63._28_4_;
        auVar36 = vfmsub231ps_fma(auVar56,auVar39,auVar55);
        auVar64._0_4_ = fVar12 * auVar36._0_4_;
        auVar64._4_4_ = fVar12 * auVar36._4_4_;
        auVar64._8_4_ = fVar12 * auVar36._8_4_;
        auVar64._12_4_ = fVar12 * auVar36._12_4_;
        auVar64._16_4_ = fVar12 * 0.0;
        auVar64._20_4_ = fVar12 * 0.0;
        auVar64._24_4_ = fVar12 * 0.0;
        auVar64._28_4_ = 0;
        auVar56 = vfmadd231ps_avx512vl(auVar64,auVar68,auVar58);
        local_9c0 = vfmadd231ps_avx512vl(auVar56,auVar66,auVar57);
        auVar56 = vaddps_avx512vl(auVar60,auVar43);
        auVar55 = vaddps_avx512vl(auVar41,auVar44);
        auVar57 = vaddps_avx512vl(auVar42,auVar45);
        auVar58 = vmulps_avx512vl(auVar55,auVar51);
        auVar58 = vfmsub231ps_avx512vl(auVar58,auVar50,auVar57);
        auVar57 = vmulps_avx512vl(auVar57,auVar49);
        auVar57 = vfmsub231ps_avx512vl(auVar57,auVar51,auVar56);
        auVar56 = vmulps_avx512vl(auVar56,auVar50);
        auVar56 = vfmsub231ps_avx512vl(auVar56,auVar49,auVar55);
        auVar55._4_4_ = fVar12 * auVar56._4_4_;
        auVar55._0_4_ = fVar12 * auVar56._0_4_;
        auVar55._8_4_ = fVar12 * auVar56._8_4_;
        auVar55._12_4_ = fVar12 * auVar56._12_4_;
        auVar55._16_4_ = fVar12 * auVar56._16_4_;
        auVar55._20_4_ = fVar12 * auVar56._20_4_;
        auVar55._24_4_ = fVar12 * auVar56._24_4_;
        auVar55._28_4_ = auVar56._28_4_;
        auVar56 = vfmadd231ps_avx512vl(auVar55,auVar68,auVar57);
        local_9a0 = vfmadd231ps_avx512vl(auVar56,auVar66,auVar58);
        auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar59 = vaddps_avx512vl(auVar43,auVar59);
        auVar43 = vaddps_avx512vl(auVar44,auVar46);
        auVar55 = vaddps_avx512vl(auVar45,auVar47);
        auVar44 = vmulps_avx512vl(auVar43,auVar54);
        auVar46 = vfmsub231ps_avx512vl(auVar44,auVar53,auVar55);
        auVar44._4_4_ = auVar55._4_4_ * auVar52._4_4_;
        auVar44._0_4_ = auVar55._0_4_ * auVar52._0_4_;
        auVar44._8_4_ = auVar55._8_4_ * auVar52._8_4_;
        auVar44._12_4_ = auVar55._12_4_ * auVar52._12_4_;
        auVar44._16_4_ = auVar55._16_4_ * auVar52._16_4_;
        auVar44._20_4_ = auVar55._20_4_ * auVar52._20_4_;
        auVar44._24_4_ = auVar55._24_4_ * auVar52._24_4_;
        auVar44._28_4_ = auVar55._28_4_;
        auVar36 = vfmsub231ps_fma(auVar44,auVar54,auVar59);
        auVar45._4_4_ = auVar59._4_4_ * auVar53._4_4_;
        auVar45._0_4_ = auVar59._0_4_ * auVar53._0_4_;
        auVar45._8_4_ = auVar59._8_4_ * auVar53._8_4_;
        auVar45._12_4_ = auVar59._12_4_ * auVar53._12_4_;
        auVar45._16_4_ = auVar59._16_4_ * auVar53._16_4_;
        auVar45._20_4_ = auVar59._20_4_ * auVar53._20_4_;
        auVar45._24_4_ = auVar59._24_4_ * auVar53._24_4_;
        auVar45._28_4_ = auVar59._28_4_;
        auVar59 = vfmsub231ps_avx512vl(auVar45,auVar52,auVar43);
        auVar59 = vmulps_avx512vl(auVar59,auVar69);
        auVar59 = vfmadd231ps_avx512vl(auVar59,auVar68,ZEXT1632(auVar36));
        auVar55 = vfmadd231ps_avx512vl(auVar59,auVar66,auVar46);
        auVar57._0_4_ = local_9c0._0_4_ + local_9a0._0_4_;
        auVar57._4_4_ = local_9c0._4_4_ + local_9a0._4_4_;
        auVar57._8_4_ = local_9c0._8_4_ + local_9a0._8_4_;
        auVar57._12_4_ = local_9c0._12_4_ + local_9a0._12_4_;
        auVar57._16_4_ = local_9c0._16_4_ + local_9a0._16_4_;
        auVar57._20_4_ = local_9c0._20_4_ + local_9a0._20_4_;
        auVar57._24_4_ = local_9c0._24_4_ + local_9a0._24_4_;
        auVar57._28_4_ = local_9c0._28_4_ + local_9a0._28_4_;
        local_980 = vaddps_avx512vl(auVar55,auVar57);
        vandps_avx512vl(local_980,auVar56);
        auVar59._8_4_ = 0x34000000;
        auVar59._0_8_ = 0x3400000034000000;
        auVar59._12_4_ = 0x34000000;
        auVar59._16_4_ = 0x34000000;
        auVar59._20_4_ = 0x34000000;
        auVar59._24_4_ = 0x34000000;
        auVar59._28_4_ = 0x34000000;
        auVar59 = vmulps_avx512vl(local_980,auVar59);
        auVar43 = vminps_avx512vl(local_9c0,local_9a0);
        auVar44 = vminps_avx512vl(auVar43,auVar55);
        auVar43._8_4_ = 0x80000000;
        auVar43._0_8_ = 0x8000000080000000;
        auVar43._12_4_ = 0x80000000;
        auVar43._16_4_ = 0x80000000;
        auVar43._20_4_ = 0x80000000;
        auVar43._24_4_ = 0x80000000;
        auVar43._28_4_ = 0x80000000;
        auVar43 = vxorps_avx512vl(auVar59,auVar43);
        uVar16 = vcmpps_avx512vl(auVar44,auVar43,5);
        auVar43 = vmaxps_avx512vl(local_9c0,local_9a0);
        auVar43 = vmaxps_avx512vl(auVar43,auVar55);
        uVar17 = vcmpps_avx512vl(auVar43,auVar59,2);
        bVar19 = (byte)uVar16 | (byte)uVar17;
        if (bVar19 != 0) {
          auVar59 = vmulps_avx512vl(auVar50,auVar40);
          auVar43 = vmulps_avx512vl(auVar39,auVar51);
          auVar55 = vmulps_avx512vl(auVar49,auVar48);
          auVar44 = vmulps_avx512vl(auVar53,auVar51);
          auVar45 = vmulps_avx512vl(auVar49,auVar54);
          auVar46 = vmulps_avx512vl(auVar52,auVar50);
          auVar47 = vfmsub213ps_avx512vl(auVar48,auVar51,auVar59);
          auVar40 = vfmsub213ps_avx512vl(auVar40,auVar49,auVar43);
          auVar39 = vfmsub213ps_avx512vl(auVar39,auVar50,auVar55);
          auVar48 = vfmsub213ps_avx512vl(auVar54,auVar50,auVar44);
          auVar50 = vfmsub213ps_avx512vl(auVar52,auVar51,auVar45);
          auVar49 = vfmsub213ps_avx512vl(auVar53,auVar49,auVar46);
          vandps_avx512vl(auVar59,auVar56);
          vandps_avx512vl(auVar44,auVar56);
          uVar22 = vcmpps_avx512vl(auVar49,auVar49,1);
          vandps_avx512vl(auVar43,auVar56);
          vandps_avx512vl(auVar45,auVar56);
          uVar34 = vcmpps_avx512vl(auVar49,auVar49,1);
          vandps_avx512vl(auVar55,auVar56);
          vandps_avx512vl(auVar46,auVar56);
          uVar18 = vcmpps_avx512vl(auVar49,auVar49,1);
          bVar32 = (bool)((byte)uVar22 & 1);
          local_960._0_4_ = (float)((uint)bVar32 * auVar47._0_4_ | (uint)!bVar32 * auVar48._0_4_);
          bVar32 = (bool)((byte)(uVar22 >> 1) & 1);
          local_960._4_4_ = (float)((uint)bVar32 * auVar47._4_4_ | (uint)!bVar32 * auVar48._4_4_);
          bVar32 = (bool)((byte)(uVar22 >> 2) & 1);
          local_960._8_4_ = (float)((uint)bVar32 * auVar47._8_4_ | (uint)!bVar32 * auVar48._8_4_);
          bVar32 = (bool)((byte)(uVar22 >> 3) & 1);
          local_960._12_4_ = (float)((uint)bVar32 * auVar47._12_4_ | (uint)!bVar32 * auVar48._12_4_)
          ;
          bVar32 = (bool)((byte)(uVar22 >> 4) & 1);
          local_960._16_4_ = (float)((uint)bVar32 * auVar47._16_4_ | (uint)!bVar32 * auVar48._16_4_)
          ;
          bVar32 = (bool)((byte)(uVar22 >> 5) & 1);
          local_960._20_4_ = (float)((uint)bVar32 * auVar47._20_4_ | (uint)!bVar32 * auVar48._20_4_)
          ;
          bVar32 = (bool)((byte)(uVar22 >> 6) & 1);
          local_960._24_4_ = (float)((uint)bVar32 * auVar47._24_4_ | (uint)!bVar32 * auVar48._24_4_)
          ;
          bVar32 = SUB81(uVar22 >> 7,0);
          local_960._28_4_ = (uint)bVar32 * auVar47._28_4_ | (uint)!bVar32 * auVar48._28_4_;
          bVar32 = (bool)((byte)uVar34 & 1);
          local_940._0_4_ = (float)((uint)bVar32 * auVar40._0_4_ | (uint)!bVar32 * auVar50._0_4_);
          bVar32 = (bool)((byte)(uVar34 >> 1) & 1);
          local_940._4_4_ = (float)((uint)bVar32 * auVar40._4_4_ | (uint)!bVar32 * auVar50._4_4_);
          bVar32 = (bool)((byte)(uVar34 >> 2) & 1);
          local_940._8_4_ = (float)((uint)bVar32 * auVar40._8_4_ | (uint)!bVar32 * auVar50._8_4_);
          bVar32 = (bool)((byte)(uVar34 >> 3) & 1);
          local_940._12_4_ = (float)((uint)bVar32 * auVar40._12_4_ | (uint)!bVar32 * auVar50._12_4_)
          ;
          bVar32 = (bool)((byte)(uVar34 >> 4) & 1);
          local_940._16_4_ = (float)((uint)bVar32 * auVar40._16_4_ | (uint)!bVar32 * auVar50._16_4_)
          ;
          bVar32 = (bool)((byte)(uVar34 >> 5) & 1);
          local_940._20_4_ = (float)((uint)bVar32 * auVar40._20_4_ | (uint)!bVar32 * auVar50._20_4_)
          ;
          bVar32 = (bool)((byte)(uVar34 >> 6) & 1);
          local_940._24_4_ = (float)((uint)bVar32 * auVar40._24_4_ | (uint)!bVar32 * auVar50._24_4_)
          ;
          bVar32 = SUB81(uVar34 >> 7,0);
          local_940._28_4_ = (uint)bVar32 * auVar40._28_4_ | (uint)!bVar32 * auVar50._28_4_;
          bVar32 = (bool)((byte)uVar18 & 1);
          local_920._0_4_ = (float)((uint)bVar32 * auVar39._0_4_ | (uint)!bVar32 * auVar49._0_4_);
          bVar32 = (bool)((byte)(uVar18 >> 1) & 1);
          local_920._4_4_ = (float)((uint)bVar32 * auVar39._4_4_ | (uint)!bVar32 * auVar49._4_4_);
          bVar32 = (bool)((byte)(uVar18 >> 2) & 1);
          local_920._8_4_ = (float)((uint)bVar32 * auVar39._8_4_ | (uint)!bVar32 * auVar49._8_4_);
          bVar32 = (bool)((byte)(uVar18 >> 3) & 1);
          local_920._12_4_ = (float)((uint)bVar32 * auVar39._12_4_ | (uint)!bVar32 * auVar49._12_4_)
          ;
          bVar32 = (bool)((byte)(uVar18 >> 4) & 1);
          local_920._16_4_ = (float)((uint)bVar32 * auVar39._16_4_ | (uint)!bVar32 * auVar49._16_4_)
          ;
          bVar32 = (bool)((byte)(uVar18 >> 5) & 1);
          local_920._20_4_ = (float)((uint)bVar32 * auVar39._20_4_ | (uint)!bVar32 * auVar49._20_4_)
          ;
          bVar32 = (bool)((byte)(uVar18 >> 6) & 1);
          local_920._24_4_ = (float)((uint)bVar32 * auVar39._24_4_ | (uint)!bVar32 * auVar49._24_4_)
          ;
          bVar32 = SUB81(uVar18 >> 7,0);
          local_920._28_4_ = (uint)bVar32 * auVar39._28_4_ | (uint)!bVar32 * auVar49._28_4_;
          auVar53._4_4_ = fVar12 * local_920._4_4_;
          auVar53._0_4_ = fVar12 * local_920._0_4_;
          auVar53._8_4_ = fVar12 * local_920._8_4_;
          auVar53._12_4_ = fVar12 * local_920._12_4_;
          auVar53._16_4_ = fVar12 * local_920._16_4_;
          auVar53._20_4_ = fVar12 * local_920._20_4_;
          auVar53._24_4_ = fVar12 * local_920._24_4_;
          auVar53._28_4_ = fVar12;
          auVar36 = vfmadd213ps_fma(auVar68,local_940,auVar53);
          auVar36 = vfmadd213ps_fma(auVar66,local_960,ZEXT1632(auVar36));
          auVar43 = ZEXT1632(CONCAT412(auVar36._12_4_ + auVar36._12_4_,
                                       CONCAT48(auVar36._8_4_ + auVar36._8_4_,
                                                CONCAT44(auVar36._4_4_ + auVar36._4_4_,
                                                         auVar36._0_4_ + auVar36._0_4_))));
          auVar54._0_4_ = auVar42._0_4_ * local_920._0_4_;
          auVar54._4_4_ = auVar42._4_4_ * local_920._4_4_;
          auVar54._8_4_ = auVar42._8_4_ * local_920._8_4_;
          auVar54._12_4_ = auVar42._12_4_ * local_920._12_4_;
          auVar54._16_4_ = auVar42._16_4_ * local_920._16_4_;
          auVar54._20_4_ = auVar42._20_4_ * local_920._20_4_;
          auVar54._24_4_ = auVar42._24_4_ * local_920._24_4_;
          auVar54._28_4_ = 0;
          auVar36 = vfmadd213ps_fma(auVar41,local_940,auVar54);
          auVar37 = vfmadd213ps_fma(auVar60,local_960,ZEXT1632(auVar36));
          auVar60 = vrcp14ps_avx512vl(auVar43);
          auVar39._8_4_ = 0x3f800000;
          auVar39._0_8_ = 0x3f8000003f800000;
          auVar39._12_4_ = 0x3f800000;
          auVar39._16_4_ = 0x3f800000;
          auVar39._20_4_ = 0x3f800000;
          auVar39._24_4_ = 0x3f800000;
          auVar39._28_4_ = 0x3f800000;
          auVar59 = vfnmadd213ps_avx512vl(auVar60,auVar43,auVar39);
          auVar36 = vfmadd132ps_fma(auVar59,auVar60,auVar60);
          uVar11 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar58._4_4_ = uVar11;
          auVar58._0_4_ = uVar11;
          auVar58._8_4_ = uVar11;
          auVar58._12_4_ = uVar11;
          auVar58._16_4_ = uVar11;
          auVar58._20_4_ = uVar11;
          auVar58._24_4_ = uVar11;
          auVar58._28_4_ = uVar11;
          auVar70 = ZEXT3264(auVar58);
          local_8a0 = ZEXT1632(CONCAT412(auVar36._12_4_ * (auVar37._12_4_ + auVar37._12_4_),
                                         CONCAT48(auVar36._8_4_ * (auVar37._8_4_ + auVar37._8_4_),
                                                  CONCAT44(auVar36._4_4_ *
                                                           (auVar37._4_4_ + auVar37._4_4_),
                                                           auVar36._0_4_ *
                                                           (auVar37._0_4_ + auVar37._0_4_)))));
          uVar16 = vcmpps_avx512vl(local_8a0,auVar58,2);
          uVar11 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar40._4_4_ = uVar11;
          auVar40._0_4_ = uVar11;
          auVar40._8_4_ = uVar11;
          auVar40._12_4_ = uVar11;
          auVar40._16_4_ = uVar11;
          auVar40._20_4_ = uVar11;
          auVar40._24_4_ = uVar11;
          auVar40._28_4_ = uVar11;
          uVar17 = vcmpps_avx512vl(local_8a0,auVar40,0xd);
          bVar19 = (byte)uVar16 & (byte)uVar17 & bVar19;
          if (bVar19 != 0) {
            local_b70 = vcmpps_avx512vl(auVar43,_DAT_01faff00,4);
            local_b70 = bVar19 & local_b70;
            if ((char)local_b70 != '\0') {
              local_900 = (char)local_b70;
              local_820 = 0xf0;
              pSVar13 = context->scene;
              auVar65._8_4_ = 0x219392ef;
              auVar65._0_8_ = 0x219392ef219392ef;
              auVar65._12_4_ = 0x219392ef;
              auVar65._16_4_ = 0x219392ef;
              auVar65._20_4_ = 0x219392ef;
              auVar65._24_4_ = 0x219392ef;
              auVar65._28_4_ = 0x219392ef;
              uVar22 = vcmpps_avx512vl(local_980,auVar65,5);
              auVar59 = vrcp14ps_avx512vl(local_980);
              auVar67._8_4_ = 0x3f800000;
              auVar67._0_8_ = 0x3f8000003f800000;
              auVar67._12_4_ = 0x3f800000;
              auVar67._16_4_ = 0x3f800000;
              auVar67._20_4_ = 0x3f800000;
              auVar67._24_4_ = 0x3f800000;
              auVar67._28_4_ = 0x3f800000;
              auVar36 = vfnmadd213ps_fma(local_980,auVar59,auVar67);
              auVar60 = vfmadd132ps_avx512vl(ZEXT1632(auVar36),auVar59,auVar59);
              fVar1 = (float)((uint)((byte)uVar22 & 1) * auVar60._0_4_);
              fVar12 = (float)((uint)((byte)(uVar22 >> 1) & 1) * auVar60._4_4_);
              fVar2 = (float)((uint)((byte)(uVar22 >> 2) & 1) * auVar60._8_4_);
              fVar3 = (float)((uint)((byte)(uVar22 >> 3) & 1) * auVar60._12_4_);
              fVar4 = (float)((uint)((byte)(uVar22 >> 4) & 1) * auVar60._16_4_);
              fVar5 = (float)((uint)((byte)(uVar22 >> 5) & 1) * auVar60._20_4_);
              fVar6 = (float)((uint)((byte)(uVar22 >> 6) & 1) * auVar60._24_4_);
              auVar20._4_4_ = fVar12 * local_9c0._4_4_;
              auVar20._0_4_ = fVar1 * local_9c0._0_4_;
              auVar20._8_4_ = fVar2 * local_9c0._8_4_;
              auVar20._12_4_ = fVar3 * local_9c0._12_4_;
              auVar20._16_4_ = fVar4 * local_9c0._16_4_;
              auVar20._20_4_ = fVar5 * local_9c0._20_4_;
              auVar20._24_4_ = fVar6 * local_9c0._24_4_;
              auVar20._28_4_ = local_9c0._28_4_;
              auVar60 = vminps_avx(auVar20,auVar67);
              auVar21._4_4_ = fVar12 * local_9a0._4_4_;
              auVar21._0_4_ = fVar1 * local_9a0._0_4_;
              auVar21._8_4_ = fVar2 * local_9a0._8_4_;
              auVar21._12_4_ = fVar3 * local_9a0._12_4_;
              auVar21._16_4_ = fVar4 * local_9a0._16_4_;
              auVar21._20_4_ = fVar5 * local_9a0._20_4_;
              auVar21._24_4_ = fVar6 * local_9a0._24_4_;
              auVar21._28_4_ = auVar59._28_4_;
              auVar59 = vminps_avx(auVar21,auVar67);
              auVar39 = vsubps_avx(auVar67,auVar60);
              auVar40 = vsubps_avx(auVar67,auVar59);
              local_8c0 = vblendps_avx(auVar59,auVar39,0xf0);
              local_8e0 = vblendps_avx(auVar60,auVar40,0xf0);
              fVar12 = (float)DAT_01fef940;
              fVar6 = DAT_01fef940._4_4_;
              local_880._4_4_ = local_960._4_4_ * fVar6;
              local_880._0_4_ = local_960._0_4_ * fVar12;
              fVar5 = DAT_01fef940._8_4_;
              local_880._8_4_ = local_960._8_4_ * fVar5;
              fVar4 = DAT_01fef940._12_4_;
              local_880._12_4_ = local_960._12_4_ * fVar4;
              fVar3 = DAT_01fef940._16_4_;
              local_880._16_4_ = local_960._16_4_ * fVar3;
              fVar2 = DAT_01fef940._20_4_;
              local_880._20_4_ = local_960._20_4_ * fVar2;
              fVar1 = DAT_01fef940._24_4_;
              local_880._24_4_ = local_960._24_4_ * fVar1;
              local_880._28_4_ = local_960._28_4_;
              local_860._4_4_ = local_940._4_4_ * fVar6;
              local_860._0_4_ = local_940._0_4_ * fVar12;
              local_860._8_4_ = local_940._8_4_ * fVar5;
              local_860._12_4_ = local_940._12_4_ * fVar4;
              local_860._16_4_ = local_940._16_4_ * fVar3;
              local_860._20_4_ = local_940._20_4_ * fVar2;
              local_860._24_4_ = local_940._24_4_ * fVar1;
              local_860._28_4_ = local_940._28_4_;
              local_840._4_4_ = local_920._4_4_ * fVar6;
              local_840._0_4_ = local_920._0_4_ * fVar12;
              local_840._8_4_ = local_920._8_4_ * fVar5;
              local_840._12_4_ = local_920._12_4_ * fVar4;
              local_840._16_4_ = local_920._16_4_ * fVar3;
              local_840._20_4_ = local_920._20_4_ * fVar2;
              local_840._24_4_ = local_920._24_4_ * fVar1;
              local_840._28_4_ = local_920._28_4_;
              do {
                local_b10 = auVar73._0_16_;
                local_b20 = auVar74._0_16_;
                local_b30 = auVar75._0_16_;
                local_b40 = auVar76._0_16_;
                local_b50 = auVar77._0_16_;
                local_b60 = auVar78._0_16_;
                uVar22 = 0;
                for (uVar34 = local_b70; (uVar34 & 1) == 0;
                    uVar34 = uVar34 >> 1 | 0x8000000000000000) {
                  uVar22 = uVar22 + 1;
                }
                pGVar14 = (pSVar13->geometries).items[*(uint *)((long)&local_9e0 + uVar22 * 4)].ptr;
                if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  local_b70 = local_b70 ^ 1L << (uVar22 & 0x3f);
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar14->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_006dd1b7:
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    return bVar33;
                  }
                  uVar34 = (ulong)(uint)((int)uVar22 * 4);
                  uVar11 = *(undefined4 *)(local_8e0 + uVar34);
                  local_a60._4_4_ = uVar11;
                  local_a60._0_4_ = uVar11;
                  local_a60._8_4_ = uVar11;
                  local_a60._12_4_ = uVar11;
                  uVar11 = *(undefined4 *)(local_8c0 + uVar34);
                  local_a50._4_4_ = uVar11;
                  local_a50._0_4_ = uVar11;
                  local_a50._8_4_ = uVar11;
                  local_a50._12_4_ = uVar11;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8a0 + uVar34);
                  local_b00.context = context->user;
                  local_a30 = vpbroadcastd_avx512vl();
                  uVar11 = *(undefined4 *)((long)&local_a00 + uVar34);
                  local_a40._4_4_ = uVar11;
                  local_a40._0_4_ = uVar11;
                  local_a40._8_4_ = uVar11;
                  local_a40._12_4_ = uVar11;
                  uVar11 = *(undefined4 *)(local_880 + uVar34);
                  local_a90._4_4_ = uVar11;
                  local_a90._0_4_ = uVar11;
                  local_a90._8_4_ = uVar11;
                  local_a90._12_4_ = uVar11;
                  uVar11 = *(undefined4 *)(local_860 + uVar34);
                  local_a80._4_4_ = uVar11;
                  local_a80._0_4_ = uVar11;
                  local_a80._8_4_ = uVar11;
                  local_a80._12_4_ = uVar11;
                  uVar11 = *(undefined4 *)(local_840 + uVar34);
                  local_a70._4_4_ = uVar11;
                  local_a70._0_4_ = uVar11;
                  local_a70._8_4_ = uVar11;
                  local_a70._12_4_ = uVar11;
                  vpcmpeqd_avx2(ZEXT1632(local_a30),ZEXT1632(local_a30));
                  uStack_a1c = (local_b00.context)->instID[0];
                  local_a20 = uStack_a1c;
                  uStack_a18 = uStack_a1c;
                  uStack_a14 = uStack_a1c;
                  uStack_a10 = (local_b00.context)->instPrimID[0];
                  uStack_a0c = uStack_a10;
                  uStack_a08 = uStack_a10;
                  uStack_a04 = uStack_a10;
                  local_b90 = local_ad0;
                  local_b00.valid = (int *)local_b90;
                  local_b00.geometryUserPtr = pGVar14->userPtr;
                  local_b00.hit = local_a90;
                  local_b00.N = 4;
                  local_ac0 = auVar70._0_32_;
                  local_b00.ray = (RTCRayN *)ray;
                  if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar14->occlusionFilterN)(&local_b00);
                    auVar70 = ZEXT3264(local_ac0);
                    auVar78 = ZEXT1664(local_b60);
                    auVar77 = ZEXT1664(local_b50);
                    auVar76 = ZEXT1664(local_b40);
                    auVar75 = ZEXT1664(local_b30);
                    auVar74 = ZEXT1664(local_b20);
                    auVar73 = ZEXT1664(local_b10);
                  }
                  uVar34 = vptestmd_avx512vl(local_b90,local_b90);
                  if ((uVar34 & 0xf) != 0) {
                    p_Var15 = context->args->filter;
                    if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var15)(&local_b00);
                      auVar70 = ZEXT3264(local_ac0);
                      auVar78 = ZEXT1664(local_b60);
                      auVar77 = ZEXT1664(local_b50);
                      auVar76 = ZEXT1664(local_b40);
                      auVar75 = ZEXT1664(local_b30);
                      auVar74 = ZEXT1664(local_b20);
                      auVar73 = ZEXT1664(local_b10);
                    }
                    auVar36 = *(undefined1 (*) [16])(local_b00.ray + 0x80);
                    uVar34 = vptestmd_avx512vl(local_b90,local_b90);
                    uVar34 = uVar34 & 0xf;
                    auVar38 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar32 = (bool)((byte)uVar34 & 1);
                    auVar37._0_4_ = (uint)bVar32 * auVar38._0_4_ | (uint)!bVar32 * auVar36._0_4_;
                    bVar32 = (bool)((byte)(uVar34 >> 1) & 1);
                    auVar37._4_4_ = (uint)bVar32 * auVar38._4_4_ | (uint)!bVar32 * auVar36._4_4_;
                    bVar32 = (bool)((byte)(uVar34 >> 2) & 1);
                    auVar37._8_4_ = (uint)bVar32 * auVar38._8_4_ | (uint)!bVar32 * auVar36._8_4_;
                    bVar32 = SUB81(uVar34 >> 3,0);
                    auVar37._12_4_ = (uint)bVar32 * auVar38._12_4_ | (uint)!bVar32 * auVar36._12_4_;
                    *(undefined1 (*) [16])(local_b00.ray + 0x80) = auVar37;
                    if ((byte)uVar34 != 0) goto LAB_006dd1b7;
                  }
                  *(int *)(ray + k * 4 + 0x80) = auVar70._0_4_;
                  local_b70 = local_b70 ^ 1L << (uVar22 & 0x3f);
                }
              } while (local_b70 != 0);
            }
          }
        }
        auVar72 = ZEXT1664(auVar71);
        auVar70 = ZEXT1664(auVar35);
        local_b78 = local_b78 + 1;
      } while (local_b78 != uVar26 - 8);
    }
LAB_006dd1a1:
    bVar33 = puVar28 != &local_800;
    if (!bVar33) {
      return bVar33;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }